

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O2

cbtBroadphaseProxy * __thiscall
cbtSimpleBroadphase::createProxy
          (cbtSimpleBroadphase *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int shapeType,
          void *userPtr,int collisionFilterGroup,int collisionFilterMask,cbtDispatcher *param_7)

{
  cbtSimpleBroadphaseProxy *pcVar1;
  undefined8 uVar2;
  int iVar3;
  
  if (this->m_numHandles < this->m_maxHandles) {
    iVar3 = allocHandle(this);
    pcVar1 = this->m_pHandles;
    pcVar1[iVar3].super_cbtBroadphaseProxy.m_clientObject = userPtr;
    pcVar1[iVar3].super_cbtBroadphaseProxy.m_collisionFilterGroup = collisionFilterGroup;
    pcVar1[iVar3].super_cbtBroadphaseProxy.m_collisionFilterMask = collisionFilterMask;
    uVar2 = *(undefined8 *)(aabbMin->m_floats + 2);
    *(undefined8 *)pcVar1[iVar3].super_cbtBroadphaseProxy.m_aabbMin.m_floats =
         *(undefined8 *)aabbMin->m_floats;
    *(undefined8 *)(pcVar1[iVar3].super_cbtBroadphaseProxy.m_aabbMin.m_floats + 2) = uVar2;
    uVar2 = *(undefined8 *)(aabbMax->m_floats + 2);
    *(undefined8 *)pcVar1[iVar3].super_cbtBroadphaseProxy.m_aabbMax.m_floats =
         *(undefined8 *)aabbMax->m_floats;
    *(undefined8 *)(pcVar1[iVar3].super_cbtBroadphaseProxy.m_aabbMax.m_floats + 2) = uVar2;
    return &pcVar1[iVar3].super_cbtBroadphaseProxy;
  }
  return (cbtBroadphaseProxy *)0x0;
}

Assistant:

cbtBroadphaseProxy* cbtSimpleBroadphase::createProxy(const cbtVector3& aabbMin, const cbtVector3& aabbMax, int shapeType, void* userPtr, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* /*dispatcher*/)
{
	if (m_numHandles >= m_maxHandles)
	{
		cbtAssert(0);
		return 0;  //should never happen, but don't let the game crash ;-)
	}
	cbtAssert(aabbMin[0] <= aabbMax[0] && aabbMin[1] <= aabbMax[1] && aabbMin[2] <= aabbMax[2]);

	int newHandleIndex = allocHandle();
	cbtSimpleBroadphaseProxy* proxy = new (&m_pHandles[newHandleIndex]) cbtSimpleBroadphaseProxy(aabbMin, aabbMax, shapeType, userPtr, collisionFilterGroup, collisionFilterMask);

	return proxy;
}